

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

void __thiscall QWidget::stackUnder(QWidget *this,QWidget *w)

{
  QWidgetPrivate *this_00;
  long lVar1;
  qsizetype qVar2;
  qsizetype qVar3;
  QWidgetPrivate *pQVar4;
  int iVar5;
  int iVar6;
  long in_FS_OFFSET;
  QWidget *local_48;
  undefined1 *puStack_40;
  QWidget *w_local;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  w_local = w;
  if (((w != (QWidget *)0x0) &&
      (((this->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
        super_QFlagsStorage<Qt::WindowType>.i & 1) == 0)) && (w != this)) {
    this_00 = *(QWidgetPrivate **)&this->field_0x8;
    lVar1 = *(long *)&this_00->field_0x10;
    if (lVar1 == *(long *)(*(long *)&w->field_0x8 + 0x10)) {
      pQVar4 = this_00;
      if (lVar1 != 0) {
        local_48 = this;
        qVar2 = QtPrivate::indexOf<QObject*,QWidget*>
                          ((QList<QObject_*> *)(*(long *)(lVar1 + 8) + 0x18),&local_48,0);
        w = (QWidget *)&w_local;
        qVar3 = QtPrivate::indexOf<QObject*,QWidget*>
                          ((QList<QObject_*> *)(*(long *)(lVar1 + 8) + 0x18),(QWidget **)w,0);
        iVar6 = (int)qVar2;
        iVar5 = (int)qVar3 - (uint)(iVar6 < (int)qVar3);
        if (iVar5 != iVar6) {
          w = (QWidget *)(long)iVar6;
          QList<QObject_*>::move
                    ((QList<QObject_*> *)(*(long *)(lVar1 + 8) + 0x18),(qsizetype)w,(long)iVar5);
        }
        pQVar4 = *(QWidgetPrivate **)&this->field_0x8;
        if (((pQVar4->high_attributes[0] & 0x10000000) == 0) &&
           ((*(byte *)(*(long *)(lVar1 + 8) + 0x243) & 0x10) != 0)) {
          w = (QWidget *)0x0;
          create(this,0,false,false);
          pQVar4 = *(QWidgetPrivate **)&this->field_0x8;
        }
        else if (iVar5 == iVar6) goto LAB_00302461;
      }
      if ((pQVar4->high_attributes[0] & 0x10000000) != 0) {
        QWidgetPrivate::stackUnder_sys(this_00,w);
      }
      local_48 = (QWidget *)&DAT_aaaaaaaaaaaaaaaa;
      puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
      QEvent::QEvent((QEvent *)&local_48,ZOrderChange);
      QCoreApplication::sendEvent(&this->super_QObject,(QEvent *)&local_48);
      QEvent::~QEvent((QEvent *)&local_48);
    }
  }
LAB_00302461:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidget::stackUnder(QWidget* w)
{
    Q_D(QWidget);
    QWidget *p = parentWidget();
    if (!w || isWindow() || p != w->parentWidget() || this == w)
        return;
    if (p) {
        int from = p->d_func()->children.indexOf(this);
        int to = p->d_func()->children.indexOf(w);
        Q_ASSERT(from >= 0);
        Q_ASSERT(to >= 0);
        if (from < to)
            --to;
        // Do nothing if the widget is already in correct stacking order _and_ created.
        if (from != to)
            p->d_func()->children.move(from, to);
        if (!testAttribute(Qt::WA_WState_Created) && p->testAttribute(Qt::WA_WState_Created))
            create();
        else if (from == to)
            return;
    }
    if (testAttribute(Qt::WA_WState_Created))
        d->stackUnder_sys(w);

    QEvent e(QEvent::ZOrderChange);
    QCoreApplication::sendEvent(this, &e);
}